

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::CombinedImageSamplerHandler
          (CombinedImageSamplerHandler *this,Compiler *compiler_)

{
  Compiler *compiler__local;
  CombinedImageSamplerHandler *this_local;
  
  OpcodeHandler::OpcodeHandler(&this->super_OpcodeHandler);
  (this->super_OpcodeHandler)._vptr_OpcodeHandler =
       (_func_int **)&PTR__CombinedImageSamplerHandler_006d64e0;
  this->compiler = compiler_;
  ::std::
  stack<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>,std::deque<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>,std::allocator<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>>>
  ::
  stack<std::deque<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>,std::allocator<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>>,void>
            ((stack<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>,std::deque<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>,std::allocator<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>>>
              *)&this->parameter_remapping);
  ::std::
  stack<spirv_cross::SPIRFunction*,std::deque<spirv_cross::SPIRFunction*,std::allocator<spirv_cross::SPIRFunction*>>>
  ::stack<std::deque<spirv_cross::SPIRFunction*,std::allocator<spirv_cross::SPIRFunction*>>,void>
            ((stack<spirv_cross::SPIRFunction*,std::deque<spirv_cross::SPIRFunction*,std::allocator<spirv_cross::SPIRFunction*>>>
              *)&this->functions);
  return;
}

Assistant:

CombinedImageSamplerHandler(Compiler &compiler_)
		    : compiler(compiler_)
		{
		}